

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.h
# Opt level: O2

void __thiscall
midi_container::limit_port_number<unsigned_long>(midi_container *this,unsigned_long *number)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  uint i;
  uchar local_11;
  
  puVar1 = (this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pointer)0x0;
  do {
    puVar3 = puVar2;
    if ((this->m_port_numbers).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish + -(long)puVar1 <= puVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->m_port_numbers,&local_11);
      puVar3 = (this->m_port_numbers).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               ~(ulong)(this->m_port_numbers).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      break;
    }
    puVar2 = (pointer)(ulong)((int)puVar3 + 1);
  } while (*number != (ulong)puVar3[(long)puVar1]);
  *number = (unsigned_long)puVar3;
  return;
}

Assistant:

void limit_port_number(T & number)
    {
        for ( unsigned i = 0; i < m_port_numbers.size(); i++ )
        {
            if ( m_port_numbers[ i ] == number )
            {
                number = i;
                return;
            }
        }
        m_port_numbers.push_back( (const uint8_t) number );
        number = m_port_numbers.size() - 1;
    }